

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O0

void BrotliInitDistanceParams(BrotliEncoderParams *params,uint32_t npostfix,uint32_t ndirect)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  BrotliDistanceCodeLimit limit;
  uint32_t max_distance;
  uint32_t alphabet_size_limit;
  uint32_t alphabet_size_max;
  BrotliDistanceParams *dist_params;
  uint32_t ndirect_local;
  uint32_t npostfix_local;
  BrotliEncoderParams *params_local;
  uint32_t start;
  uint32_t extra;
  uint32_t postfix;
  uint32_t group;
  uint32_t half;
  uint32_t tmp;
  uint32_t ndistbits;
  uint32_t offset;
  uint32_t forbidden_distance;
  uint32_t local_10;
  uint32_t uStack_c;
  BrotliDistanceCodeLimit result;
  
  (params->dist).distance_postfix_bits = npostfix;
  (params->dist).num_direct_distance_codes = ndirect;
  bVar1 = (byte)npostfix;
  limit.max_distance = ndirect + 0x10 + (0x18 << (bVar1 + 1 & 0x1f));
  limit.max_alphabet_size = (ndirect + (1 << (bVar1 + 0x1a & 0x1f))) - (1 << (bVar1 + 2 & 0x1f));
  max_distance = limit.max_distance;
  if (params->large_window != 0) {
    if (ndirect < 0x7ffffffc) {
      half = 0;
      uVar3 = (1 << (bVar1 & 0x1f)) - 1;
      uVar4 = (0x7ffffffc - ndirect >> (bVar1 & 0x1f)) + 4;
      group = uVar4;
      while (group = group >> 1, group != 0) {
        half = half + 1;
      }
      uVar4 = (half - 2) * 2 | uVar4 >> ((char)half - 1U & 0x1f) & 1;
      if (uVar4 == 0) {
        local_10 = ndirect + 0x10;
        uStack_c = ndirect;
      }
      else {
        uVar4 = uVar4 - 1;
        cVar2 = (char)(uVar4 >> 1);
        bVar5 = cVar2 + 1;
        local_10 = (uVar4 << (bVar1 & 0x1f) | uVar3) + ndirect + 0x11;
        uStack_c = (((uVar4 & 1) << (bVar5 & 0x1f)) + (1 << (cVar2 + 2U & 0x1f)) +
                    (1 << (bVar5 & 0x1f)) + -5 << (bVar1 & 0x1f)) + uVar3 + ndirect + 1;
      }
    }
    else {
      local_10 = 0x8000000c;
      uStack_c = 0x7ffffffc;
    }
    max_distance = ndirect + 0x10 + (0x3e << (bVar1 + 1 & 0x1f));
    limit.max_distance = local_10;
    limit.max_alphabet_size = uStack_c;
  }
  (params->dist).alphabet_size_max = max_distance;
  (params->dist).alphabet_size_limit = limit.max_distance;
  (params->dist).max_distance = (ulong)limit.max_alphabet_size;
  return;
}

Assistant:

void BrotliInitDistanceParams(BrotliEncoderParams* params,
    uint32_t npostfix, uint32_t ndirect) {
  BrotliDistanceParams* dist_params = &params->dist;
  uint32_t alphabet_size_max;
  uint32_t alphabet_size_limit;
  uint32_t max_distance;

  dist_params->distance_postfix_bits = npostfix;
  dist_params->num_direct_distance_codes = ndirect;

  alphabet_size_max = BROTLI_DISTANCE_ALPHABET_SIZE(
      npostfix, ndirect, BROTLI_MAX_DISTANCE_BITS);
  alphabet_size_limit = alphabet_size_max;
  max_distance = ndirect + (1U << (BROTLI_MAX_DISTANCE_BITS + npostfix + 2)) -
      (1U << (npostfix + 2));

  if (params->large_window) {
    BrotliDistanceCodeLimit limit = BrotliCalculateDistanceCodeLimit(
        BROTLI_MAX_ALLOWED_DISTANCE, npostfix, ndirect);
    alphabet_size_max = BROTLI_DISTANCE_ALPHABET_SIZE(
        npostfix, ndirect, BROTLI_LARGE_MAX_DISTANCE_BITS);
    alphabet_size_limit = limit.max_alphabet_size;
    max_distance = limit.max_distance;
  }

  dist_params->alphabet_size_max = alphabet_size_max;
  dist_params->alphabet_size_limit = alphabet_size_limit;
  dist_params->max_distance = max_distance;
}